

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O3

int oonf_stream_add(oonf_stream_socket *stream_socket,netaddr_socket *local)

{
  oonf_socket_entry *entry;
  os_fd *sock;
  list_entity **pplVar1;
  short sVar2;
  int iVar3;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  netaddr_socket *pnVar8;
  ulong uVar9;
  byte bVar10;
  netaddr_str buf;
  
  bVar10 = 0;
  sVar2 = netaddr_socket_get_port(local);
  if (sVar2 == 0) {
LAB_0010f3ae:
    pnVar8 = &stream_socket->local_socket;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pnVar8 = *(undefined8 *)local;
      local = (netaddr_socket *)((long)local + (ulong)bVar10 * -0x10 + 8);
      pnVar8 = (netaddr_socket *)((long)pnVar8 + (ulong)bVar10 * -0x10 + 8);
    }
    if ((stream_socket->config).memcookie == (oonf_class *)0x0) {
      (stream_socket->config).memcookie = &_connection_cookie;
    }
    if ((stream_socket->config).allowed_sessions == 0) {
      (stream_socket->config).allowed_sessions = 10;
    }
    if ((stream_socket->config).maximum_input_buffer == 0) {
      (stream_socket->config).maximum_input_buffer = 0x10000;
    }
    (stream_socket->session).prev = &stream_socket->session;
    (stream_socket->session).next = &stream_socket->session;
    (stream_socket->_node).next = &_stream_head;
    (stream_socket->_node).prev = _stream_head.prev;
    pplVar1 = &(_stream_head.prev)->next;
    _stream_head.prev = &stream_socket->_node;
    *pplVar1 = &stream_socket->_node;
    iVar3 = 0;
  }
  else {
    entry = &stream_socket->scheduler_entry;
    sock = &(stream_socket->scheduler_entry).fd;
    iVar3 = os_fd_generic_getsocket
                      (sock,local,true,0,(os_interface *)0x0,_oonf_stream_socket_subsystem.logging);
    if (iVar3 == 0) {
      iVar3 = listen(sock->fd,1);
      if (iVar3 != -1) {
        (stream_socket->scheduler_entry).name = stream_socket->socket_name;
        (stream_socket->scheduler_entry).process = _cb_parse_request;
        uVar4 = netaddr_socket_to_string(&buf,local);
        snprintf(stream_socket->socket_name,0x4c,"tcp-server: %s",uVar4);
        oonf_socket_add(entry);
        oonf_socket_set_read(entry,true);
        goto LAB_0010f3ae;
      }
      uVar9 = (ulong)_oonf_stream_socket_subsystem.logging;
      if (((&log_global_mask)[uVar9] & 4) != 0) {
        uVar4 = netaddr_socket_to_string(&buf,local);
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        oonf_log(4,uVar9,"src/base/oonf_stream_socket.c",0xac,0,0,
                 "tcp socket listen failed for %s: %s (%d)\n",uVar4,pcVar6,*piVar5);
      }
    }
    oonf_socket_remove(entry);
    iVar3 = -1;
    if (sock->fd != -1) {
      close(sock->fd);
      sock->fd = -1;
    }
  }
  return iVar3;
}

Assistant:

int
oonf_stream_add(struct oonf_stream_socket *stream_socket, const union netaddr_socket *local) {
  struct netaddr_str buf;

  /* server socket not necessary for outgoing connections */
  if (netaddr_socket_get_port(local) != 0) {
    /* Init socket */
    if (os_fd_getsocket(&stream_socket->scheduler_entry.fd, local, true, 0, NULL, LOG_STREAM)) {
      goto add_stream_error;
    }

    /* show that we are willing to listen */
    if (os_fd_listen(&stream_socket->scheduler_entry.fd, 1) == -1) {
      OONF_WARN(LOG_STREAM, "tcp socket listen failed for %s: %s (%d)\n", netaddr_socket_to_string(&buf, local),
        strerror(errno), errno);
      goto add_stream_error;
    }
    stream_socket->scheduler_entry.name = stream_socket->socket_name;
    stream_socket->scheduler_entry.process = _cb_parse_request;

    snprintf(stream_socket->socket_name, sizeof(stream_socket->socket_name), "tcp-server: %s",
      netaddr_socket_to_string(&buf, local));
    oonf_socket_add(&stream_socket->scheduler_entry);
    oonf_socket_set_read(&stream_socket->scheduler_entry, true);
  }
  memcpy(&stream_socket->local_socket, local, sizeof(stream_socket->local_socket));

  if (stream_socket->config.memcookie == NULL) {
    stream_socket->config.memcookie = &_connection_cookie;
  }
  if (stream_socket->config.allowed_sessions == 0) {
    stream_socket->config.allowed_sessions = 10;
  }
  if (stream_socket->config.maximum_input_buffer == 0) {
    stream_socket->config.maximum_input_buffer = 65536;
  }

  list_init_head(&stream_socket->session);
  list_add_tail(&_stream_head, &stream_socket->_node);

  return 0;

add_stream_error:
  oonf_socket_remove(&stream_socket->scheduler_entry);
  os_fd_close(&stream_socket->scheduler_entry.fd);
  return -1;
}